

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.hpp
# Opt level: O1

Adjacency_Graph<false> *
Disa::create_graph_structured<false>
          (Adjacency_Graph<false> *__return_storage_ptr__,size_t number_vertices)

{
  unsigned_long uVar1;
  long lVar2;
  ulong uVar3;
  size_t i_x;
  ulong uVar4;
  Edge local_58;
  ulong local_48;
  size_t local_40;
  long local_38;
  
  (__return_storage_ptr__->offset).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->offset).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->vertex_adjacent_list).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->offset).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->vertex_adjacent_list).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (__return_storage_ptr__->vertex_adjacent_list).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  if (number_vertices != 0) {
    local_38 = -number_vertices;
    lVar2 = 0;
    uVar3 = 0;
    local_48 = number_vertices;
    local_40 = number_vertices;
    do {
      uVar4 = 0;
      do {
        uVar1 = uVar4 + lVar2;
        if (uVar4 != 0) {
          local_58.first = (uVar4 + lVar2) - 1;
          local_58.second = uVar1;
          Adjacency_Graph<false>::insert(__return_storage_ptr__,&local_58);
        }
        if (number_vertices - 1 != uVar4) {
          local_58.second = uVar4 + lVar2 + 1;
          local_58.first = uVar1;
          Adjacency_Graph<false>::insert(__return_storage_ptr__,&local_58);
        }
        if (uVar3 != 0) {
          local_58.first = local_38 + uVar4;
          local_58.second = uVar1;
          Adjacency_Graph<false>::insert(__return_storage_ptr__,&local_58);
        }
        if (uVar3 < number_vertices - 1) {
          local_58.second = local_40 + uVar4;
          local_58.first = uVar1;
          Adjacency_Graph<false>::insert(__return_storage_ptr__,&local_58);
        }
        uVar4 = uVar4 + 1;
      } while (local_48 != uVar4);
      uVar3 = uVar3 + 1;
      lVar2 = lVar2 + local_48;
      local_38 = local_38 + local_48;
      local_40 = local_40 + local_48;
    } while (uVar3 != local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

Adjacency_Graph<_directed> create_graph_structured(std::size_t number_vertices) {
  Adjacency_Graph<_directed> structured;
  for(std::size_t i_y = 0; i_y < number_vertices; ++i_y) {
    for(std::size_t i_x = 0; i_x < number_vertices; ++i_x) {
      const std::size_t i_vertex = i_y * (number_vertices) + i_x;
      if(!_directed && i_x != 0) structured.insert({i_vertex - 1, i_vertex});
      if(i_x != number_vertices - 1) structured.insert({i_vertex, i_vertex + 1});
      if(!_directed && i_y != 0) structured.insert({i_vertex - number_vertices, i_vertex});
      if(i_y < number_vertices - 1) structured.insert({i_vertex, i_vertex + number_vertices});
    }
  }
  return structured;
}